

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::generateShuffledRamp
               (int numElements,vector<int,_std::allocator<int>_> *ramp)

{
  reference pvVar1;
  iterator first;
  iterator last;
  int local_38;
  int callNdx;
  undefined1 local_28 [8];
  Random rng;
  vector<int,_std::allocator<int>_> *ramp_local;
  int numElements_local;
  
  rng.m_rnd._8_8_ = ramp;
  de::Random::Random((Random *)local_28,0xabcd);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)rng.m_rnd._8_8_,(long)numElements);
  for (local_38 = 0; local_38 < numElements; local_38 = local_38 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)rng.m_rnd._8_8_,(long)local_38);
    *pvVar1 = local_38 + 1;
  }
  first = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)rng.m_rnd._8_8_);
  last = std::vector<int,_std::allocator<int>_>::end
                   ((vector<int,_std::allocator<int>_> *)rng.m_rnd._8_8_);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_28,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)last._M_current);
  de::Random::~Random((Random *)local_28);
  return;
}

Assistant:

void generateShuffledRamp (int numElements, std::vector<int>& ramp)
{
	de::Random rng(0xabcd);

	// some positive (non-zero) unique values
	ramp.resize(numElements);
	for (int callNdx = 0; callNdx < numElements; ++callNdx)
		ramp[callNdx] = callNdx + 1;

	rng.shuffle(ramp.begin(), ramp.end());
}